

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
FeatureUnsupportedFailure::FeatureUnsupportedFailure
          (FeatureUnsupportedFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *featureName,SimpleString *text)

{
  char *pcVar1;
  SimpleString local_68 [2];
  SimpleString *local_38;
  SimpleString *text_local;
  SimpleString *featureName_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  FeatureUnsupportedFailure *this_local;
  
  local_38 = text;
  text_local = featureName;
  featureName_local = (SimpleString *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure =
       (_func_int **)&PTR__FeatureUnsupportedFailure_0042ece8;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  pcVar1 = SimpleString::asCharString(text_local);
  StringFromFormat((char *)local_68,
                   "The feature \"%s\" is not supported in this environment or with the feature set selected when building the library."
                   ,pcVar1);
  SimpleString::operator+=(&(this->super_TestFailure).message_,local_68);
  SimpleString::~SimpleString(local_68);
  return;
}

Assistant:

FeatureUnsupportedFailure::FeatureUnsupportedFailure(UtestShell* test, const char* fileName, size_t lineNumber,
                                                     const SimpleString& featureName, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += StringFromFormat("The feature \"%s\" is not supported in this environment or with the feature set selected when building the library.", featureName.asCharString());
}